

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[52],unsigned_int,char[26],unsigned_int,char[30],unsigned_int,char[26],unsigned_int,char[114]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [52],uint *Args_1,
          char (*Args_2) [26],uint *Args_3,char (*Args_4) [30],uint *Args_5,char (*Args_6) [26],
          uint *Args_7,char (*Args_8) [114])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[52],unsigned_int,char[26],unsigned_int,char[30],unsigned_int,char[26],unsigned_int,char[114]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [52])this,(uint *)Args,(char (*) [26])Args_1,(uint *)Args_2,
             (char (*) [30])Args_3,(uint *)Args_4,(char (*) [26])Args_5,(uint *)Args_6,
             (char (*) [114])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}